

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O0

SquareMatrix<float> * __thiscall
qclab::dense::SquareMatrix<float>::operator*=(SquareMatrix<float> *this,SquareMatrix<float> *rhs)

{
  float fVar1;
  float fVar2;
  int64_t iVar3;
  float *pfVar4;
  pointer pfVar5;
  long lVar6;
  long local_38;
  int64_t k;
  int64_t i;
  int64_t j;
  unique_ptr<float[],_std::default_delete<float[]>_> new_data;
  SquareMatrix<float> *rhs_local;
  SquareMatrix<float> *this_local;
  
  lVar6 = this->size_;
  new_data._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl =
       (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)
       (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)rhs;
  iVar3 = size(rhs);
  if (lVar6 == iVar3) {
    init_unique_array<float>((dense *)&j,this->size_ * this->size_);
    for (i = 0; i < this->size_; i = i + 1) {
      for (k = 0; k < this->size_; k = k + 1) {
        for (local_38 = 0; local_38 < this->size_; local_38 = local_38 + 1) {
          pfVar4 = operator()(this,k,local_38);
          fVar1 = *pfVar4;
          pfVar4 = operator()((SquareMatrix<float> *)
                              new_data._M_t.
                              super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                              super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                              super__Head_base<0UL,_float_*,_false>._M_head_impl,local_38,i);
          fVar2 = *pfVar4;
          pfVar5 = std::unique_ptr<float[],_std::default_delete<float[]>_>::get
                             ((unique_ptr<float[],_std::default_delete<float[]>_> *)&j);
          lVar6 = k + i * this->size_;
          pfVar5[lVar6] = fVar1 * fVar2 + pfVar5[lVar6];
        }
      }
    }
    std::unique_ptr<float[],_std::default_delete<float[]>_>::operator=
              (&this->data_,(unique_ptr<float[],_std::default_delete<float[]>_> *)&j);
    std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr
              ((unique_ptr<float[],_std::default_delete<float[]>_> *)&j);
    return this;
  }
  __assert_fail("size_ == rhs.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/include/qclab/dense/SquareMatrix.hpp"
                ,0xb0,
                "SquareMatrix<T> &qclab::dense::SquareMatrix<float>::operator*=(const SquareMatrix<T> &) [T = float]"
               );
}

Assistant:

inline SquareMatrix< T >& operator*=( const SquareMatrix< T >& rhs ) {
          assert( size_ == rhs.size() ) ;
          auto new_data = init_unique_array< T >( size_ * size_ ) ;
          #pragma omp parallel for
          for ( int64_t j = 0; j < size_; j++ ) {
            for ( int64_t i = 0; i < size_; i++ ) {
              for ( int64_t k = 0; k < size_; k++ ) {
                new_data.get()[ i + j*size_ ] += (*this)(i,k) * rhs(k,j) ;
              }
            }
          }
          data_ = std::move( new_data ) ;
          return *this ;
        }